

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void nn_pipebase_sent(nn_pipebase *self)

{
  if (self->outstate == '\x02') {
    self->outstate = '\x03';
    return;
  }
  if (self->outstate == '\x04') {
    self->outstate = '\x01';
    nn_fsm_raise(&self->fsm,&self->out,0x84c4);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->outstate == NN_PIPEBASE_OUTSTATE_ASYNC",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
          ,0x76);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_pipebase_sent (struct nn_pipebase *self)
{
    if (nn_fast (self->outstate == NN_PIPEBASE_OUTSTATE_SENDING)) {
        self->outstate = NN_PIPEBASE_OUTSTATE_SENT;
        return;
    }
    nn_assert (self->outstate == NN_PIPEBASE_OUTSTATE_ASYNC);
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);
}